

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O3

void __thiscall
bytearray_undo_rec::bytearray_undo_rec
          (bytearray_undo_rec *this,CVmObjByteArray *arr,unsigned_long start_idx,unsigned_long cnt)

{
  bytearray_undo_bytes *pbVar1;
  bytearray_undo_bytes *pbVar2;
  size_t len;
  
  this->idx_ = start_idx;
  this->cnt_ = cnt;
  this->save_head_ = (bytearray_undo_bytes *)0x0;
  if (cnt != 0) {
    pbVar2 = (bytearray_undo_bytes *)0x0;
    do {
      len = 0x8000;
      if (cnt < 0x8000) {
        len = cnt;
      }
      pbVar1 = (bytearray_undo_bytes *)malloc(len + 0xf);
      if (pbVar2 == (bytearray_undo_bytes *)0x0) {
        pbVar2 = (bytearray_undo_bytes *)&this->save_head_;
      }
      pbVar2->nxt_ = pbVar1;
      pbVar1->nxt_ = (bytearray_undo_bytes *)0x0;
      CVmObjByteArray::copy_to_buf(arr,pbVar1->buf_,start_idx,len);
      start_idx = start_idx + len;
      cnt = cnt - len;
      pbVar2 = pbVar1;
    } while (cnt != 0);
  }
  return;
}

Assistant:

bytearray_undo_rec(CVmObjByteArray *arr, unsigned long start_idx,
                       unsigned long cnt)
    {
        unsigned long idx;
        unsigned long rem;
        bytearray_undo_bytes *tail;

        /* remember the starting index and length of the saved data */
        idx_ = start_idx;
        cnt_ = cnt;
        
        /* store the original data in a linked list of byte blocks */
        for (idx = start_idx, rem = cnt, save_head_ = tail = 0 ;
             rem != 0 ; )
        {
            bytearray_undo_bytes *p;
            size_t cur;

            /* allocate up to 32k, or the amount remaining if lower */
            cur = 32768;
            if (cur > rem)
                cur = (size_t)rem;
            
            /* allocate a new block */
            p = (bytearray_undo_bytes *)t3malloc(
                sizeof(bytearray_undo_bytes) + cur - 1);

            /* link this block into our list */
            if (tail != 0)
                tail->nxt_ = p;
            else
                save_head_ = p;
            tail = p;
            p->nxt_ = 0;
                
            /* copy bytes into this block */
            arr->copy_to_buf(p->buf_, idx, cur);

            /* move past the copied bytes */
            idx += cur;
            rem -= cur;
        }
    }